

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_mdl.h
# Opt level: O1

void __thiscall
ExampleModel::
WriteDVarExpr<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::ExprArgWriter>
          (ExampleModel *this,int i,ExprArgWriter *ew)

{
  File *pFVar1;
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *pNVar2;
  double r;
  
  switch(i) {
  case 0:
    ew->nargs_ = ew->nargs_ + -1;
    pNVar2 = ew->nlw_;
    pFVar1 = &pNVar2->nm;
    mp::BinaryFormatter::apr(&pNVar2->super_FormatterType,pFVar1,"o%d\t#%s\n",0xf,"abs");
    mp::BinaryFormatter::apr(&pNVar2->super_FormatterType,pFVar1,"o%d\t#%s\n",0,"+");
    mp::BinaryFormatter::nput(&pNVar2->super_FormatterType,pFVar1,-2.0);
    mp::BinaryFormatter::apr(&pNVar2->super_FormatterType,pFVar1,"v%d\t#%s\n",0,"y");
    return;
  case 1:
    ew->nargs_ = ew->nargs_ + -1;
    pNVar2 = ew->nlw_;
    pFVar1 = &pNVar2->nm;
    r = 0.0;
    break;
  case 2:
    ew->nargs_ = ew->nargs_ + -1;
    pNVar2 = ew->nlw_;
    pFVar1 = &pNVar2->nm;
    mp::BinaryFormatter::apr(&pNVar2->super_FormatterType,pFVar1,"o%d\t#%s\n",0,"+");
    mp::BinaryFormatter::apr(&pNVar2->super_FormatterType,pFVar1,"v%d\t#%s\n",2,"nl(t3)");
    r = 6.38;
    break;
  case 3:
    ew->nargs_ = ew->nargs_ + -1;
    pNVar2 = ew->nlw_;
    pFVar1 = &pNVar2->nm;
    mp::BinaryFormatter::apr(&pNVar2->super_FormatterType,pFVar1,"o%d\t#%s\n",5,"^");
    mp::BinaryFormatter::apr(&pNVar2->super_FormatterType,pFVar1,"v%d\t#%s\n",0,"y");
    r = 2.0;
    break;
  default:
    return;
  }
  mp::BinaryFormatter::nput(&pNVar2->super_FormatterType,pFVar1,r);
  return;
}

Assistant:

void WriteDVarExpr(int i, EWriter& ew) const {
    using namespace mp::nl;
    switch (i) {
    case 0:                  // nl(t3)
    {
      auto ew01 = ew.OPut1(ABS); // unary opcode
      // The argument:
      {                          // Can also split code / name:
        auto ew0101 = ew01.OPut2(ADD.code, "+"); // binary opcode
        ew0101.NPut(-2);         // 1st arg
        ew0101.VPut(0, "y");     // 2nd arg
      }
    } break;
    case 1:                  // t2
      ew.NPut(0);            // no non-linear part
      break;
    case 2:                  // t3
    {
      auto ew01 = ew.OPut2(ADD);
      ew01.VPut(2, "nl(t3)");
      ew01.NPut(6.38);
    } break;
    case 3:                  // t1
    {
      auto ew01 = ew.OPut2(POW);
      ew01.VPut(0, "y");
      ew01.NPut(2);
    } break;
    default:
      assert(false);
    {}
    }
  }